

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::CompiledModule::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,CompiledModule *this,Orphanage orphanage)

{
  size_t sVar1;
  Reader decl;
  bool bVar2;
  size_type sVar3;
  reference pSVar4;
  CompiledModule **ppCVar5;
  uint64_t value;
  StringPtr importPath;
  ArrayPtr<const_char> local_198;
  CompiledModule *local_188;
  Fault local_180 [2];
  size_t sStack_170;
  undefined1 local_160 [16];
  CompiledModule *_kj_result;
  Builder entry;
  StringPtr name;
  _Self local_110;
  iterator __end2;
  iterator __begin2;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *__range2;
  undefined1 local_f0 [4];
  uint i;
  BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  builder;
  ReaderFor<capnp::compiler::ParsedFile> local_b8;
  undefined1 local_88 [40];
  word wStack_60;
  undefined1 local_58 [8];
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> importNames;
  CompiledModule *this_local;
  Orphanage orphanage_local;
  Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  *result;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (CompiledModule *)orphanage.arena;
  importNames._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::set
            ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
             local_58);
  Orphan<capnp::compiler::ParsedFile>::getReader(&local_b8,&this->content);
  ParsedFile::Reader::getRoot((Reader *)local_88,&local_b8);
  decl._reader.capTable = (CapTableReader *)local_88._8_8_;
  decl._reader.segment = (SegmentReader *)local_88._0_8_;
  decl._reader.data = (void *)local_88._16_8_;
  decl._reader.pointers = (WirePointer *)local_88._24_8_;
  decl._reader.dataSize = local_88._32_4_;
  decl._reader.pointerCount = local_88._36_2_;
  decl._reader._38_2_ = local_88._38_2_;
  decl._reader._40_8_ = wStack_60.content;
  findImports(decl,(set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                   local_58);
  builder.builder.structDataSize._3_1_ = 0;
  sVar3 = std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::size
                    ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *
                     )local_58);
  Orphanage::
  newOrphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,(capnp::Kind)3>>
            (__return_storage_ptr__,(Orphanage *)&this_local,(uint)sVar3);
  Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>::
  get((BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
       *)local_f0,__return_storage_ptr__);
  __range2._4_4_ = 0;
  __end2 = std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::begin
                     ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
                       *)local_58);
  local_110._M_node =
       (_Base_ptr)
       std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::end
                 ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                  local_58);
  while( true ) {
    bVar2 = std::operator==(&__end2,&local_110);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      builder.builder.structDataSize._3_1_ = 1;
      std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::~set
                ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                 local_58);
      return __return_storage_ptr__;
    }
    pSVar4 = std::_Rb_tree_const_iterator<kj::StringPtr>::operator*(&__end2);
    entry._builder._32_8_ = (pSVar4->content).ptr;
    sVar1 = (pSVar4->content).size_;
    List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>::Builder::
    operator[]((Builder *)&_kj_result,(Builder *)local_f0,__range2._4_4_);
    local_180[1].exception = (Exception *)entry._builder._32_8_;
    importPath.content.size_._0_4_ = entry._builder.dataSize;
    importPath.content.size_._4_2_ = entry._builder.pointerCount;
    importPath.content.size_._6_2_ = entry._builder._38_2_;
    importPath.content.ptr = (char *)this;
    sStack_170 = sVar1;
    importRelative((CompiledModule *)local_160,importPath);
    local_160._8_8_ =
         kj::_::readMaybe<capnp::compiler::Compiler::CompiledModule>
                   ((Maybe<capnp::compiler::Compiler::CompiledModule_&> *)local_160);
    if ((CompiledModule *)local_160._8_8_ == (CompiledModule *)0x0) break;
    ppCVar5 = kj::mv<capnp::compiler::Compiler::CompiledModule*>((CompiledModule **)(local_160 + 8))
    ;
    local_188 = *ppCVar5;
    value = Node::getId(&local_188->rootNode);
    capnp::schema::CodeGeneratorRequest::RequestedFile::Import::Builder::setId
              ((Builder *)&_kj_result,value);
    Text::Reader::Reader((Reader *)&local_198,(StringPtr *)&entry._builder.dataSize);
    capnp::schema::CodeGeneratorRequest::RequestedFile::Import::Builder::setName
              ((Builder *)&_kj_result,(Reader)local_198);
    std::_Rb_tree_const_iterator<kj::StringPtr>::operator++(&__end2);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  kj::_::Debug::Fault::Fault
            (local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x46f,FAILED,"importRelative(name) != nullptr","");
  kj::_::Debug::Fault::fatal(local_180);
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::CompiledModule::getFileImportTable(Orphanage orphanage) {
  // Build a table of imports for CodeGeneratorRequest.RequestedFile.imports. Note that we only
  // care about type imports, not constant value imports, since constant values (including default
  // values) are already embedded in full in the schema. In other words, we only need the imports
  // that would need to be #included in the generated code.

  std::set<kj::StringPtr> importNames;
  findImports(content.getReader().getRoot(), importNames);

  auto result = orphanage.newOrphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>(
      importNames.size());
  auto builder = result.get();

  uint i = 0;
  for (auto name: importNames) {
    // We presumably ran this import before, so it shouldn't throw now.
    auto entry = builder[i++];
    entry.setId(KJ_ASSERT_NONNULL(importRelative(name)).rootNode.getId());
    entry.setName(name);
  }

  return result;
}